

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  size_t in_RDX;
  void *in_RSI;
  Grammer g;
  Grammer GStack_138;
  Grammer local_a0;
  
  GStack_138.Vn._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &GStack_138.Vn._M_t._M_impl.super__Rb_tree_header._M_header;
  GStack_138.Vn._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  GStack_138.Vn._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  GStack_138.Vn._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  GStack_138.Vt._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &GStack_138.Vt._M_t._M_impl.super__Rb_tree_header._M_header;
  GStack_138.Vt._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  GStack_138.Vt._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  GStack_138.Vt._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  GStack_138.grammer_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &GStack_138.grammer_map._M_t._M_impl.super__Rb_tree_header._M_header;
  GStack_138.grammer_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  GStack_138.grammer_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  GStack_138.grammer_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  GStack_138.Vn._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       GStack_138.Vn._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  GStack_138.Vt._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       GStack_138.Vt._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  GStack_138.grammer_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       GStack_138.grammer_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  read((int)&GStack_138,in_RSI,in_RDX);
  Grammer::Grammer(&local_a0,&GStack_138);
  Elimination(&local_a0);
  Grammer::~Grammer(&local_a0);
  Grammer::~Grammer(&GStack_138);
  return 0;
}

Assistant:

int main()
{
    Grammer g;
    read(g);
    //map<char, string>::iterator it;
    //for (it = g.grammer_map.begin(); it != g.grammer_map.end(); it++)
    //cout << (*it).first << "->" << (*it).second<<endl;
    Elimination(g);
//	system("pause");
    return 0;
}